

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_7::TwoLevelIterator::SetDataIterator
          (TwoLevelIterator *this,Iterator *data_iter)

{
  Iterator *pIVar1;
  char *in_RAX;
  char *pcVar2;
  char *local_28;
  
  pIVar1 = (this->data_iter_).iter_;
  if (pIVar1 != (Iterator *)0x0) {
    local_28 = in_RAX;
    (*pIVar1->_vptr_Iterator[10])(&local_28);
    if (local_28 != (char *)0x0 && (this->status_).state_ == (char *)0x0) {
      pcVar2 = Status::CopyState(local_28);
      (this->status_).state_ = pcVar2;
    }
    if (local_28 != (char *)0x0) {
      operator_delete__(local_28);
    }
  }
  IteratorWrapper::Set(&this->data_iter_,data_iter);
  return;
}

Assistant:

void TwoLevelIterator::SetDataIterator(Iterator* data_iter) {
  if (data_iter_.iter() != nullptr) SaveError(data_iter_.status());
  data_iter_.Set(data_iter);
}